

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O3

void tonk_socket_destroy(TonkSocket tonkSocket,uint32_t shouldBlock)

{
  ApplicationSession *session;
  thread local_18;
  ApplicationSession *local_10;
  
  if (tonkSocket != (TonkSocket)0x0) {
    local_10 = (ApplicationSession *)tonkSocket;
    if (shouldBlock != 0) {
      tonk::ApplicationSession::tonk_socket_destroy((ApplicationSession *)tonkSocket);
      (**(code **)(*(long *)tonkSocket + 8))(tonkSocket);
      DecrementSessionCounter();
      return;
    }
    std::thread::thread<void(&)(tonk::ApplicationSession*),tonk::ApplicationSession*&,void>
              (&local_18,destroy_session,&local_10);
    std::thread::detach();
    if (local_18._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

TONK_EXPORT void tonk_socket_destroy(
    TonkSocket tonkSocket, ///< [in] Socket to shutdown
    uint32_t shouldBlock   ///< [in] Boolean: Should this function block?
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (session)
    {
        if (shouldBlock) {
            destroy_session(session);
        }
        else {
            std::thread(destroy_session, session).detach();
        }
    }
}